

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O1

int xattr_new(archive_read *a,xar *xar,xmlattr_list *list)

{
  xmlattr *pxVar1;
  char *__s;
  xattr *pxVar2;
  int iVar3;
  xattr *pxVar4;
  size_t sVar5;
  xattr *pxVar6;
  uint uVar7;
  uint64_t uVar8;
  size_t sVar9;
  bool bVar10;
  
  pxVar4 = (xattr *)calloc(1,0xb0);
  if (pxVar4 == (xattr *)0x0) {
    archive_set_error(&a->archive,0xc,"Out of memory");
    iVar3 = -0x1e;
  }
  else {
    xar->xattr = pxVar4;
    for (pxVar1 = list->first; pxVar1 != (xmlattr *)0x0; pxVar1 = pxVar1->next) {
      iVar3 = strcmp(pxVar1->name,"id");
      if (iVar3 == 0) {
        __s = pxVar1->value;
        sVar5 = strlen(__s);
        if ((sVar5 == 0) || (uVar7 = (int)*__s - 0x30, 9 < uVar7)) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          sVar9 = 1;
          do {
            uVar8 = (ulong)uVar7 + uVar8 * 10;
            uVar7 = (int)__s[sVar9] - 0x30;
            if (9 < uVar7) break;
            bVar10 = sVar5 != sVar9;
            sVar9 = sVar9 + 1;
          } while (bVar10);
        }
        pxVar4->id = uVar8;
      }
    }
    pxVar2 = (xattr *)&xar->file->xattr_list;
    do {
      pxVar6 = pxVar2;
      pxVar2 = pxVar6->next;
      if (pxVar2 == (xattr *)0x0) break;
    } while (pxVar2->id <= pxVar4->id);
    pxVar4->next = pxVar2;
    pxVar6->next = pxVar4;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int
xattr_new(struct archive_read *a, struct xar *xar, struct xmlattr_list *list)
{
	struct xattr *xattr, **nx;
	struct xmlattr *attr;

	xattr = calloc(1, sizeof(*xattr));
	if (xattr == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	xar->xattr = xattr;
	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "id") == 0)
			xattr->id = atol10(attr->value, strlen(attr->value));
	}
	/* Chain to xattr list. */
	for (nx = &(xar->file->xattr_list);
	    *nx != NULL; nx = &((*nx)->next)) {
		if (xattr->id < (*nx)->id)
			break;
	}
	xattr->next = *nx;
	*nx = xattr;

	return (ARCHIVE_OK);
}